

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerSpreadCall(Lowerer *this,Instr *instr,CallFlags callFlags,bool setupProfiledVersion)

{
  LowererMD *this_00;
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  int32 iVar4;
  Opnd *pOVar5;
  RegOpnd *functionObjOpnd;
  LabelInstr *continueAfterExLabel;
  Instr *pIVar6;
  undefined4 *puVar7;
  Opnd *newSrc;
  IntConstOpnd *pIVar8;
  RegOpnd *opndArg;
  HelperCallOpnd *newSrc_00;
  JitProfilingInstr *jitInstr;
  ushort callFlags_00;
  JnHelperMethod fnHelper;
  ArgSlot local_34;
  
  pOVar5 = IR::Instr::UnlinkSrc1(instr);
  functionObjOpnd = IR::Opnd::AsRegOpnd(pOVar5);
  functionObjOpnd->field_0x18 = functionObjOpnd->field_0x18 | 2;
  if (((callFlags | setupProfiledVersion) & CallFlags_New) == CallFlags_None) {
    continueAfterExLabel = InsertContinueAfterExceptionLabelForDebugger(this->m_func,instr,false);
    LowererMDArch::GenerateFunctionObjectTest
              (&(this->m_lowererMD).lowererMDArch,instr,functionObjOpnd,false,continueAfterExLabel);
  }
  pIVar6 = GetLdSpreadIndicesInstr(instr);
  if (pIVar6->m_opcode != LdSpreadIndices) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69a1,"(spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices)",
                       "spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  callFlags_00 = (ushort)callFlags;
  pOVar5 = IR::Instr::UnlinkSrc1(pIVar6);
  newSrc = IR::Instr::UnlinkSrc2(pIVar6);
  IR::Instr::ReplaceSrc2(instr,newSrc);
  if ((callFlags & CallFlags_New) == CallFlags_None) {
    uVar2 = 2;
    if (instr->m_dst == (Opnd *)0x0) {
      uVar2 = 0x10;
    }
    callFlags_00 = callFlags_00 | uVar2;
  }
  this_00 = &this->m_lowererMD;
  iVar4 = LowererMD::LowerCallArgs
                    (this_00,instr,callFlags_00,
                     (ushort)setupProfiledVersion + (ushort)setupProfiledVersion * 2 + 2);
  fnHelper = HelperSpreadCall;
  if (setupProfiledVersion) {
    pIVar8 = IR::Opnd::CreateProfileIdOpnd
                       (*(ProfileId *)((long)&instr[1]._vptr_Instr + 2),this->m_func);
    LowererMD::LoadHelperArgument(this_00,instr,&pIVar8->super_Opnd);
    pIVar8 = IR::Opnd::CreateProfileIdOpnd(*(ProfileId *)&instr[1]._vptr_Instr,this->m_func);
    LowererMD::LoadHelperArgument(this_00,instr,&pIVar8->super_Opnd);
    opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
    fnHelper = HelperProfiledNewScObjArraySpread;
  }
  LowererMD::LoadHelperArgument(this_00,instr,&functionObjOpnd->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,instr,pOVar5);
  newSrc_00 = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  IR::Instr::SetSrc1(instr,&newSrc_00->super_Opnd);
  local_34 = (ArgSlot)iVar4;
  pIVar6 = LowererMD::LowerCall(this_00,instr,local_34);
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LowerSpreadCall(IR::Instr *instr, Js::CallFlags callFlags, bool setupProfiledVersion)
{
    // Get the target function object, and emit function object test.
    IR::RegOpnd * functionObjOpnd = instr->UnlinkSrc1()->AsRegOpnd();
    functionObjOpnd->m_isCallArg = true;

    if (!(callFlags & Js::CallFlags_New) && !setupProfiledVersion)
    {
        IR::LabelInstr* continueAfterExLabel = InsertContinueAfterExceptionLabelForDebugger(m_func, instr, false);
        this->m_lowererMD.GenerateFunctionObjectTest(instr, functionObjOpnd, false, continueAfterExLabel);
    }

    IR::Instr *spreadIndicesInstr;

    spreadIndicesInstr = GetLdSpreadIndicesInstr(instr);
    Assert(spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices);

    // Get AuxArray
    IR::Opnd *spreadIndicesOpnd = spreadIndicesInstr->UnlinkSrc1();
    // Remove LdSpreadIndices from the argument chain
    instr->ReplaceSrc2(spreadIndicesInstr->UnlinkSrc2());

    // Emit the normal args
    if (!(callFlags & Js::CallFlags_New))
    {
        callFlags = (Js::CallFlags)(callFlags | (instr->GetDst() ? Js::CallFlags_Value : Js::CallFlags_NotUsed));
    }

    // Profiled helper call requires three more parameters, ArrayProfileId, profileId, and the frame pointer.
    // This is just following the convention of HelperProfiledNewScObjArray call.
    const unsigned short extraArgsCount = setupProfiledVersion ? 5 : 2; // function object and AuxArray
    int32 argCount = this->m_lowererMD.LowerCallArgs(instr, (ushort)callFlags, extraArgsCount);

    // Emit our extra (first) args for the Spread helper in reverse order
    if (setupProfiledVersion)
    {
        IR::JitProfilingInstr* jitInstr = (IR::JitProfilingInstr*)instr;
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(jitInstr->arrayProfileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(jitInstr->profileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateFramePointerOpnd(m_func));
    }

    m_lowererMD.LoadHelperArgument(instr, functionObjOpnd);
    m_lowererMD.LoadHelperArgument(instr, spreadIndicesOpnd);

    // Change the call target to our helper
    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(setupProfiledVersion ? IR::HelperProfiledNewScObjArraySpread : IR::HelperSpreadCall, this->m_func);
    instr->SetSrc1(helperOpnd);

    return this->m_lowererMD.LowerCall(instr, (Js::ArgSlot)argCount);
}